

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_packing.cpp
# Opt level: O1

void __thiscall
packing::AssignedProtos::assign<packing::ProtoPalAttrs>(AssignedProtos *this,ProtoPalAttrs *args)

{
  _Bit_type *p_Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  __normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>
  this_00;
  
  this_00 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>*,std::vector<std::optional<packing::ProtoPalAttrs>,std::allocator<std::optional<packing::ProtoPalAttrs>>>>,__gnu_cxx::__ops::_Iter_negate<packing::AssignedProtos::assign<packing::ProtoPalAttrs>(packing::ProtoPalAttrs&&)::_lambda(std::optional<packing::ProtoPalAttrs>const&)_1_>>
                      ((this->_assigned).
                       super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (this->_assigned).
                       super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  if (this_00._M_current !=
      (this->_assigned).
      super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::_Optional_payload_base<packing::ProtoPalAttrs>::_M_reset
              ((_Optional_payload_base<packing::ProtoPalAttrs> *)this_00._M_current);
    ((this_00._M_current)->super__Optional_base<packing::ProtoPalAttrs,_false,_false>)._M_payload.
    super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
    super__Optional_payload_base<packing::ProtoPalAttrs>._M_payload._M_value.protoPalIndex =
         args->protoPalIndex;
    *(_Bit_pointer *)
     ((long)&((this_00._M_current)->super__Optional_base<packing::ProtoPalAttrs,_false,_false>).
             _M_payload.super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
             super__Optional_payload_base<packing::ProtoPalAttrs>._M_payload._M_value.bannedPages.
             super__Bvector_base<std::allocator<bool>_> + 0x20) =
         (args->bannedPages).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_end_of_storage;
    p_Var1 = (args->bannedPages).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar2 = *(undefined8 *)
             &(args->bannedPages).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
    uVar3 = *(undefined8 *)
             &(args->bannedPages).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
    (((_Bit_iterator *)
     ((long)&((this_00._M_current)->super__Optional_base<packing::ProtoPalAttrs,_false,_false>).
             _M_payload.super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
             super__Optional_payload_base<packing::ProtoPalAttrs>._M_payload._M_value.bannedPages.
             super__Bvector_base<std::allocator<bool>_> + 0x10))->super__Bit_iterator_base)._M_p =
         (args->bannedPages).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
    *(undefined8 *)
     ((long)&((this_00._M_current)->super__Optional_base<packing::ProtoPalAttrs,_false,_false>).
             _M_payload.super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
             super__Optional_payload_base<packing::ProtoPalAttrs>._M_payload._M_value.bannedPages.
             super__Bvector_base<std::allocator<bool>_> + 0x18) = uVar3;
    *(_Bit_type **)
     &((this_00._M_current)->super__Optional_base<packing::ProtoPalAttrs,_false,_false>)._M_payload.
      super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
      super__Optional_payload_base<packing::ProtoPalAttrs>._M_payload._M_value.bannedPages.
      super__Bvector_base<std::allocator<bool>_>._M_impl = p_Var1;
    *(undefined8 *)
     ((long)&((this_00._M_current)->super__Optional_base<packing::ProtoPalAttrs,_false,_false>).
             _M_payload.super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
             super__Optional_payload_base<packing::ProtoPalAttrs>._M_payload._M_value.bannedPages.
             super__Bvector_base<std::allocator<bool>_> + 8) = uVar2;
    (args->bannedPages).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    (args->bannedPages).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_offset = 0;
    (args->bannedPages).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    (args->bannedPages).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_offset = 0;
    (args->bannedPages).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
    ((this_00._M_current)->super__Optional_base<packing::ProtoPalAttrs,_false,_false>)._M_payload.
    super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
    super__Optional_payload_base<packing::ProtoPalAttrs>._M_engaged = true;
    return;
  }
  std::
  vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
  ::emplace_back<packing::ProtoPalAttrs>(&this->_assigned,args);
  return;
}

Assistant:

void assign(Ts &&...args) {
		auto freeSlot = std::find_if_not(
		    _assigned.begin(), _assigned.end(),
		    [](std::optional<ProtoPalAttrs> const &slot) { return slot.has_value(); });

		if (freeSlot == _assigned.end()) { // We are full, use a new slot
			_assigned.emplace_back(std::forward<Ts>(args)...);
		} else { // Reuse a free slot
			freeSlot->emplace(std::forward<Ts>(args)...);
		}
	}